

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_map.cc
# Opt level: O1

void __thiscall
bloaty::sourcemap::SourceMapObjectFile::ProcessFileToSink(SourceMapObjectFile *this,RangeSink *sink)

{
  char cVar1;
  InputFile *pIVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  int iVar7;
  char *pcVar8;
  Arg *in_R9;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  sources;
  int32_t values [5];
  string_view local_100;
  int local_ec;
  string local_e8;
  undefined1 local_c8 [16];
  basic_string_view<char,_std::char_traits<char>_> *local_b8;
  undefined1 local_a8 [8];
  _Alloc_hider _Stack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  char *local_80;
  Arg local_78;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (1 < sink->data_source_ - kCompileUnits) {
    Throw("Source map doesn\'t support this data source",0xdb);
  }
  pIVar2 = (this->super_ObjectFile).file_data_._M_t.
           super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t.
           super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
           super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl;
  local_100._M_len = (pIVar2->data_)._M_len;
  local_100._M_str = (pIVar2->data_)._M_str;
  if (local_100._M_len == 0) {
    Throw("premature EOF reading fixed-length data",0x8d);
  }
  local_100._M_str = local_100._M_str + 1;
  local_100._M_len = local_100._M_len - 1;
  local_c8 = (undefined1  [16])0x0;
  local_b8 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  FindField(&local_100,"sources");
  if (local_100._M_len == 0) {
    local_a8 = (undefined1  [8])0x3;
    _Stack_a0._M_p = "EOF";
  }
  else {
    if (*local_100._M_str == '[') {
      local_100._M_str = local_100._M_str + 1;
      local_100._M_len = local_100._M_len - 1;
      if (local_100._M_len != 0) {
        do {
          SkipWhitespace(&local_100);
          if (local_100._M_len == 0) break;
          if (*local_100._M_str == ',') {
            local_100._M_str = local_100._M_str + 1;
            local_100._M_len = local_100._M_len - 1;
          }
          else if (*local_100._M_str == ']') {
            local_100._M_str = local_100._M_str + 1;
            local_100._M_len = local_100._M_len - 1;
            break;
          }
          _local_a8 = ReadQuotedString(&local_100);
          if ((basic_string_view<char,_std::char_traits<char>_> *)local_c8._8_8_ == local_b8) {
            std::
            vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
            ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                      ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                        *)local_c8,(iterator)local_c8._8_8_,
                       (basic_string_view<char,_std::char_traits<char>_> *)local_a8);
          }
          else {
            *(size_t *)local_c8._8_8_ = (size_t)local_a8;
            *(pointer *)(local_c8._8_8_ + 8) = _Stack_a0._M_p;
            local_c8._8_8_ =
                 (basic_string_view<char,_std::char_traits<char>_> *)(local_c8._8_8_ + 0x10);
          }
        } while (local_100._M_len != 0);
      }
      SkipWhitespace(&local_100);
      if (local_100._M_len == 0) {
        local_a8 = (undefined1  [8])0x3;
        _Stack_a0._M_p = "EOF";
      }
      else {
        if (*local_100._M_str == ',') {
          local_100._M_str = local_100._M_str + 1;
          local_100._M_len = local_100._M_len - 1;
          FindField(&local_100,"mappings");
          if (local_100._M_len == 0) {
            local_a8 = (undefined1  [8])0x3;
            _Stack_a0._M_p = "EOF";
          }
          else {
            if (*local_100._M_str == '\"') {
              local_100._M_str = local_100._M_str + 1;
              local_100._M_len = local_100._M_len - 1;
              if ((local_100._M_len != 0) && (*local_100._M_str != '\"')) {
                iVar4 = ReadBase64VLQSegment(&local_100,(int32_t (*) [5])&local_78);
                if (iVar4 < 4) {
                  iVar4 = 0x95;
                  pcVar8 = "Source file info expected in first VLQ segment";
LAB_0019bee7:
                  Throw(pcVar8,iVar4);
                }
                if (local_100._M_len != 0) {
                  local_48 = local_78.piece_._M_str;
                  uStack_40 = 0;
                  local_ec = (int)local_78.piece_._M_len;
                  iVar7 = local_78.piece_._M_len._4_4_;
                  do {
                    while( true ) {
                      sVar6 = local_100._M_len - 1;
                      pcVar8 = local_100._M_str + 1;
                      cVar1 = *local_100._M_str;
                      if (cVar1 != ',') break;
                      local_100._M_len = sVar6;
                      local_100._M_str = pcVar8;
                      if (sVar6 == 0) goto LAB_0019be86;
                    }
                    if (cVar1 == '\"') break;
                    if (cVar1 == ';') {
                      iVar4 = 0xa4;
                      pcVar8 = "Unsupported line separator in source map";
                      goto LAB_0019bee7;
                    }
                    iVar5 = ReadBase64VLQSegment(&local_100,(int32_t (*) [5])&local_78);
                    if (3 < iVar4) {
                      lVar3 = *(long *)(local_c8._0_8_ + 8 + (long)iVar7 * 0x10);
                      local_a8._4_4_ = (int)local_78.piece_._M_len;
                      local_a8._0_4_ = local_ec;
                      _Stack_a0._M_p = (pointer)&local_90;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)(local_a8 + 8),lVar3,
                                 *(long *)(local_c8._0_8_ + (long)iVar7 * 0x10) + lVar3);
                      local_80 = local_48;
                      VlqSegment::addToSink((VlqSegment *)local_a8,sink);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_Stack_a0._M_p != &local_90) {
                        operator_delete(_Stack_a0._M_p,local_90._M_allocated_capacity + 1);
                      }
                    }
                    local_ec = local_ec + (int)local_78.piece_._M_len;
                    if (3 < iVar5) {
                      local_48 = (char *)CONCAT44(local_48._4_4_ +
                                                  (int)((ulong)local_78.piece_._M_str >> 0x20),
                                                  (int)local_48 + (int)local_78.piece_._M_str);
                      iVar7 = local_78.piece_._M_len._4_4_ + iVar7;
                    }
                    iVar4 = iVar5;
                  } while (local_100._M_len != 0);
                }
              }
LAB_0019be86:
              if (local_100._M_len == 0) {
                local_a8 = (undefined1  [8])0x3;
                _Stack_a0._M_p = "EOF";
              }
              else {
                if (*local_100._M_str == '\"') {
                  local_100._M_str = local_100._M_str + 1;
                  local_100._M_len = local_100._M_len - 1;
                  if ((void *)local_c8._0_8_ != (void *)0x0) {
                    operator_delete((void *)local_c8._0_8_,(long)local_b8 - local_c8._0_8_);
                  }
                  return;
                }
                local_a8 = (undefined1  [8])0x1;
                _Stack_a0._M_p = local_100._M_str;
              }
              local_78.piece_._M_str = local_78.scratch_;
              local_78.piece_._M_len = 1;
              local_78.scratch_[0] = '\"';
              format_02._M_str = local_a8;
              format_02._M_len = (size_t)"unexpected \'$0\', expected \'$1\'";
              absl::Substitute_abi_cxx11_(&local_e8,(absl *)0x1e,format_02,&local_78,in_R9);
              Throw(local_e8._M_dataplus._M_p,0xb7);
            }
            local_a8 = (undefined1  [8])0x1;
            _Stack_a0._M_p = local_100._M_str;
          }
          local_78.piece_._M_str = local_78.scratch_;
          local_78.piece_._M_len = 1;
          local_78.scratch_[0] = '\"';
          format_01._M_str = local_a8;
          format_01._M_len = (size_t)"unexpected \'$0\', expected \'$1\'";
          absl::Substitute_abi_cxx11_(&local_e8,(absl *)0x1e,format_01,&local_78,in_R9);
          Throw(local_e8._M_dataplus._M_p,0xb7);
        }
        local_a8 = (undefined1  [8])0x1;
        _Stack_a0._M_p = local_100._M_str;
      }
      local_78.piece_._M_str = local_78.scratch_;
      local_78.piece_._M_len = 1;
      local_78.scratch_[0] = ',';
      format_00._M_str = local_a8;
      format_00._M_len = (size_t)"unexpected \'$0\', expected \'$1\'";
      absl::Substitute_abi_cxx11_(&local_e8,(absl *)0x1e,format_00,&local_78,in_R9);
      Throw(local_e8._M_dataplus._M_p,0xb7);
    }
    local_a8 = (undefined1  [8])0x1;
    _Stack_a0._M_p = local_100._M_str;
  }
  local_78.piece_._M_str = local_78.scratch_;
  local_78.piece_._M_len = 1;
  local_78.scratch_[0] = '[';
  format._M_str = local_a8;
  format._M_len = (size_t)"unexpected \'$0\', expected \'$1\'";
  absl::Substitute_abi_cxx11_(&local_e8,(absl *)0x1e,format,&local_78,in_R9);
  Throw(local_e8._M_dataplus._M_p,0xb7);
}

Assistant:

void addToSink(RangeSink* sink) const {
    auto name = sink->data_source() == DataSource::kInlines
        ? source_file + ":" + std::to_string(source_line)
        : source_file;
    sink->AddFileRange("sourcemap", name, col, length);
  }